

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::get_indices
          (TrimeshPrimitiveManager *this,int face_index,uint *i0,uint *i1,uint *i2)

{
  uchar *puVar1;
  uint uVar2;
  long lVar3;
  
  puVar1 = this->indexbase;
  lVar3 = (long)face_index * (long)this->indexstride;
  if (this->indicestype == PHY_SHORT) {
    *i0 = (uint)*(ushort *)(puVar1 + lVar3);
    *i1 = (uint)*(ushort *)(puVar1 + lVar3 + 2);
    uVar2 = (uint)*(ushort *)(puVar1 + lVar3 + 4);
  }
  else {
    *i0 = *(uint *)(puVar1 + lVar3);
    *i1 = *(uint *)(puVar1 + lVar3 + 4);
    uVar2 = *(uint *)(puVar1 + lVar3 + 8);
  }
  *i2 = uVar2;
  return;
}

Assistant:

SIMD_FORCE_INLINE void get_indices(int face_index, unsigned int& i0, unsigned int& i1, unsigned int& i2) const
		{
			if (indicestype == PHY_SHORT)
			{
				unsigned short* s_indices = (unsigned short*)(indexbase + face_index * indexstride);
				i0 = s_indices[0];
				i1 = s_indices[1];
				i2 = s_indices[2];
			}
			else
			{
				unsigned int* i_indices = (unsigned int*)(indexbase + face_index * indexstride);
				i0 = i_indices[0];
				i1 = i_indices[1];
				i2 = i_indices[2];
			}
		}